

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

void __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>
::sherwood_v3_table(sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>
                    *this,sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>
                          *other,
                   allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>
                   *alloc)

{
  sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>
  *psVar1;
  const_iterator begin;
  
  psVar1 = empty_default_table<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>
                     ();
  this->entries = psVar1;
  this->num_slots_minus_one = 0;
  this->hash_policy = '?';
  this->max_lookups = '\x03';
  this->_max_load_factor = other->_max_load_factor;
  this->num_elements = 0;
  rehash_for_other_container(this,other);
  begin = sherwood_v3_table<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_const_slang::syntax::SyntaxNode_*,_slang::Hasher<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueHasher<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::Hasher<const_slang::syntax::SyntaxNode_*>_>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_ska::detailv3::KeyOrValueEquality<const_slang::syntax::SyntaxNode_*,_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_std::equal_to<const_slang::syntax::SyntaxNode_*>_>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>_>_>
          ::begin(other);
  sherwood_v3_table<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::syntax::SyntaxNode_const*,slang::Hasher<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::Hasher<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,std::equal_to<slang::syntax::SyntaxNode_const*>>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>>>
  ::
  insert<ska::detailv3::sherwood_v3_table<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::syntax::SyntaxNode_const*,slang::Hasher<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::Hasher<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,std::equal_to<slang::syntax::SyntaxNode_const*>>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>>>::templated_iterator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>const>>
            ((sherwood_v3_table<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::syntax::SyntaxNode_const*,slang::Hasher<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueHasher<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,slang::Hasher<slang::syntax::SyntaxNode_const*>>,std::equal_to<slang::syntax::SyntaxNode_const*>,ska::detailv3::KeyOrValueEquality<slang::syntax::SyntaxNode_const*,std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,std::equal_to<slang::syntax::SyntaxNode_const*>>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>>>>
              *)this,(templated_iterator<const_std::pair<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>_>
                      )begin.current,
             other->entries + other->num_slots_minus_one + (long)other->max_lookups);
  return;
}

Assistant:

sherwood_v3_table(const sherwood_v3_table & other, const ArgumentAlloc & alloc)
        : EntryAlloc(alloc), Hasher(other), Equal(other), _max_load_factor(other._max_load_factor)
    {
        rehash_for_other_container(other);
        try
        {
            insert(other.begin(), other.end());
        }
        catch(...)
        {
            clear();
            deallocate_data(entries, num_slots_minus_one, max_lookups);
            throw;
        }
    }